

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

node_t find_maximum(flags_map_t *f)

{
  pointer pvVar1;
  long lVar2;
  node_t nVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  pvVar1 = (f->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  nVar3.first = 0;
  nVar3.second = 0;
  lVar5 = (long)(f->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 3) * -0x5555555555555555;
    lVar6 = 0;
    uVar4 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      lVar7 = (long)*(pointer *)
                     ((long)&pvVar1[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8) - lVar2;
      if (lVar7 != 0) {
        lVar7 = lVar7 >> 2;
        uVar8 = 0;
        do {
          if (*(int *)(*(long *)&pvVar1[(int)uVar4].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data + (long)nVar3.first * 4) <
              *(int *)(lVar2 + uVar8 * 4)) {
            nVar3 = (node_t)(uVar8 & 0xffffffff);
            uVar4 = (uint)lVar6;
          }
          uVar8 = uVar8 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != uVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
    nVar3 = (node_t)((long)nVar3 << 0x20 | (ulong)uVar4);
  }
  return nVar3;
}

Assistant:

node_t find_maximum(const flags_map_t f)
{
    node_t result(0, 0);
    for (size_t i = 0; i < f.size(); i++)
    {
        for (size_t j = 0; j < f[i].size(); j++)
        {
            if (f[i][j] > f[result.first][result.second])
            {
                result = node_t(i, j);
            }
        }
    }

    return result;
}